

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# traverser_base.h
# Opt level: O2

void __thiscall
draco::
TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
::Init(TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
       *this,CornerTable *corner_table,TraversalObserver traversal_observer)

{
  this->corner_table_ = corner_table;
  std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
            (&this->is_face_visited_,
             (long)(int)((ulong)((long)(corner_table->corner_table_->corner_to_vertex_map_).vector_.
                                       super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(corner_table->corner_table_->corner_to_vertex_map_).vector_.
                                       super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 2) / 3),false);
  std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
            (&this->is_vertex_visited_,
             (long)(int)((ulong)((long)(this->corner_table_->vertex_to_attribute_entry_id_map_).
                                       super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->corner_table_->vertex_to_attribute_entry_id_map_).
                                      super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2),false);
  (this->traversal_observer_).mesh_ = traversal_observer.mesh_;
  (this->traversal_observer_).sequencer_ = traversal_observer.sequencer_;
  (this->traversal_observer_).att_connectivity_ = traversal_observer.att_connectivity_;
  (this->traversal_observer_).encoding_data_ = traversal_observer.encoding_data_;
  return;
}

Assistant:

virtual void Init(const CornerTable *corner_table,
                    TraversalObserver traversal_observer) {
    corner_table_ = corner_table;
    is_face_visited_.assign(corner_table->num_faces(), false);
    is_vertex_visited_.assign(corner_table_->num_vertices(), false);
    traversal_observer_ = traversal_observer;
  }